

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O2

bool __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::IsLinearMapping
          (TPZGeoBlend<pzgeom::TPZGeoLinear> *this,int side)

{
  long lVar1;
  bool bVar2;
  TPZStack<int,_10> LowAllSides;
  
  TPZStack<int,_10>::TPZStack(&LowAllSides);
  pztopology::TPZLine::LowerDimensionSides(side,&LowAllSides);
  if (2 < (uint)side) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
               ,0x28);
  }
  if ((side == 2) && (this->fNeighbours[0].fGeoElIndex != -1)) {
    bVar2 = false;
  }
  else {
    lVar1 = 0;
    if (LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements < 1) {
      LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements = lVar1;
    }
    while ((bVar2 = LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements == lVar1,
           !bVar2 && ((LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore[lVar1] < 2
                      || (this->fNeighbours
                          [LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore[lVar1] -
                           2].fGeoElIndex == -1))))) {
      lVar1 = lVar1 + 1;
    }
  }
  TPZManVector<int,_10>::~TPZManVector(&LowAllSides.super_TPZManVector<int,_10>);
  return bVar2;
}

Assistant:

bool pzgeom::TPZGeoBlend<TGeo>::IsLinearMapping(int side) const
{
    TPZStack<int> LowAllSides;
    TGeo::LowerDimensionSides(side,LowAllSides);
    if(side < 0 || side > TGeo::NSides-1)
    {
        DebugStop();
        return 0;
    }
    bool straight = true;
    
    if(side >= TGeo::NNodes && fNeighbours[side-TGeo::NNodes].ElementIndex() != -1)
    {
        straight = false;
        return straight;
    }
    for(int lowside = 0; lowside < LowAllSides.NElements(); lowside++)
    {
        if(LowAllSides[lowside] >= TGeo::NNodes && fNeighbours[LowAllSides[lowside]-TGeo::NNodes].ElementIndex() != -1)
        {
            straight = false;
            return straight;
        }
    }
    return straight;
}